

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O0

void destroy_empty_constraint(Constraint *constraint)

{
  void *in_RDI;
  
  *(undefined8 *)((long)in_RDI + 8) = 0;
  *(undefined8 *)((long)in_RDI + 0x60) = 0;
  *(undefined8 *)((long)in_RDI + 0x18) = 0;
  *(undefined8 *)((long)in_RDI + 0x20) = 0;
  *(undefined8 *)((long)in_RDI + 0x10) = 0;
  if (*(long *)((long)in_RDI + 0x58) != 0) {
    free(*(void **)((long)in_RDI + 0x58));
  }
  free(in_RDI);
  return;
}

Assistant:

void destroy_empty_constraint(Constraint *constraint) {
    constraint->name = NULL;
    constraint->parameter_name = NULL;
    constraint->compare = NULL;
    constraint->execute = NULL;
    constraint->destroy = NULL;

    if (constraint->expected_value_name != NULL)
        free((void *)constraint->expected_value_name);

    free(constraint);
}